

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O0

Input * __thiscall
helics::ValueFederateManager::getInputByTarget(ValueFederateManager *this,string_view key)

{
  bool bVar1;
  allocator<char> *__a;
  BlockIterator<helics::Input,_32,_helics::Input_**> ret;
  handle inps;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>
  res;
  shared_handle TIDhandle;
  key_type *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  shared_guarded_opt<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
  *in_stack_ffffffffffffff28;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  *this_00;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  uint uVar2;
  BlockIterator<helics::Input,_32,_helics::Input_**> local_b0;
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  local_98;
  undefined1 local_69 [33];
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>
  local_48;
  shared_lock_handle<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
  local_38 [2];
  Input *local_8;
  
  gmlc::libguarded::
  shared_guarded_opt<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
  ::lock_shared(in_stack_ffffffffffffff28);
  __a = (allocator<char> *)
        gmlc::libguarded::
        shared_lock_handle<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
        ::operator->(local_38);
  this_00 = (shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
             *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (basic_string_view<char,_std::char_traits<char>_> *)this_00,__a);
  local_48 = std::
             multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>
             ::equal_range((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>
                            *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                           in_stack_fffffffffffffee8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  bVar1 = std::operator==(&local_48.first,&local_48.second);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock(this_00);
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::operator->(&local_98);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>
                  *)0x2e06bf);
    gmlc::containers::
    DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
              ((DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
                *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (InterfaceHandle *)this_00);
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::operator->(&local_98);
    gmlc::containers::
    DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::end
              ((DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
                *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    bVar1 = gmlc::containers::BlockIterator<helics::Input,32,helics::Input**>::operator!=
                      ((BlockIterator<helics::Input,_32,_helics::Input_**> *)
                       CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                       (BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> *)
                       in_stack_fffffffffffffee8);
    if (bVar1) {
      local_8 = gmlc::containers::BlockIterator<helics::Input,_32,_helics::Input_**>::operator*
                          (&local_b0);
    }
    uVar2 = (uint)bVar1;
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                    *)0x2e07d5);
    if (uVar2 != 0) goto LAB_002e07f8;
  }
  local_8 = (Input *)invalidIptNC;
LAB_002e07f8:
  gmlc::libguarded::
  shared_lock_handle<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
              *)0x2e0805);
  return local_8;
}

Assistant:

Input& ValueFederateManager::getInputByTarget(std::string_view key)
{
    auto TIDhandle = targetIDs.lock_shared();
    auto res = TIDhandle->equal_range(std::string(key));
    if (res.first != res.second) {
        auto inps = inputs.lock();
        auto ret = inps->find(res.first->second);
        if (ret != inps->end()) {
            return *ret;
        }
    }
    return invalidIptNC;
}